

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  int iVar1;
  uint8_t *puVar2;
  int iVar3;
  
  iVar1 = b->bits_left;
  do {
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      b->p = b->p + 1;
      iVar1 = 8;
    }
  } while (iVar1 != 8);
  b->bits_left = 8;
  if (h->pps->entropy_coding_mode_flag != 0) {
    puVar2 = b->p;
    if (puVar2 < b->end) {
      iVar1 = b->bits_left;
      iVar3 = 0;
      do {
        iVar1 = iVar1 + -1;
        if (iVar1 == 0) {
          puVar2 = puVar2 + 1;
          b->p = puVar2;
          iVar1 = 8;
        }
        iVar3 = iVar3 + 1;
      } while ((iVar3 != 0x10) || (iVar3 = 0, puVar2 < b->end));
      b->bits_left = iVar1;
    }
  }
  return;
}

Assistant:

void read_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    read_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            /* cabac_zero_word */ bs_skip_u(b, 16);
        }
    }
}